

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btSoftBody::RContact>::resize
          (btAlignedObjectArray<btSoftBody::RContact> *this,int newsize,RContact *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  RContact *pRVar3;
  btCollisionObject *pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = this->m_size;
  lVar9 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar8 = lVar9 * 0x78 + 0x58;
    for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
      pRVar3 = this->m_data;
      *(Node **)((long)(&(pRVar3->m_cti).m_normal + -4) + lVar8) = fillData->m_node;
      pbVar4 = (fillData->m_cti).m_colObj;
      uVar5 = *(undefined8 *)(fillData->m_cti).m_normal.m_floats;
      uVar6 = *(undefined8 *)&(fillData->m_cti).m_offset;
      puVar1 = (undefined8 *)((long)(&(pRVar3->m_cti).m_normal + -5) + lVar8);
      *puVar1 = *(undefined8 *)((fillData->m_cti).m_normal.m_floats + 2);
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)(&(pRVar3->m_cti).m_normal + -6) + lVar8);
      *puVar1 = pbVar4;
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)((fillData->m_c0).m_el[0].m_floats + 2);
      puVar1 = (undefined8 *)((long)(pRVar3->m_cti).m_normal.m_floats + lVar8 + -0x38);
      *puVar1 = *(undefined8 *)(fillData->m_c0).m_el[0].m_floats;
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)((fillData->m_c0).m_el[1].m_floats + 2);
      puVar1 = (undefined8 *)((long)(&pRVar3->m_cti + -1) + lVar8);
      *puVar1 = *(undefined8 *)(fillData->m_c0).m_el[1].m_floats;
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)((fillData->m_c0).m_el[2].m_floats + 2);
      puVar1 = (undefined8 *)((long)(pRVar3->m_cti).m_normal.m_floats + lVar8 + -0x18);
      *puVar1 = *(undefined8 *)(fillData->m_c0).m_el[2].m_floats;
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)((fillData->m_c1).m_floats + 2);
      uVar6 = *(undefined8 *)((fillData->m_c1).m_floats + 3);
      uVar7 = *(undefined8 *)&fillData->m_c3;
      puVar1 = (undefined8 *)((long)(pRVar3->m_cti).m_normal.m_floats + lVar8 + -8);
      *puVar1 = *(undefined8 *)(fillData->m_c1).m_floats;
      puVar1[1] = uVar5;
      puVar1 = (undefined8 *)((long)(pRVar3->m_cti).m_normal.m_floats + lVar8 + 4);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      lVar8 = lVar8 + 0x78;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}